

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generic_section.cpp
# Opt level: O2

void __thiscall
GenericSectionImport_TextBadAlignValue_Test::~GenericSectionImport_TextBadAlignValue_Test
          (GenericSectionImport_TextBadAlignValue_Test *this)

{
  anon_unknown.dwarf_20a167::GenericSectionImport::~GenericSectionImport
            (&this->super_GenericSectionImport);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (GenericSectionImport, TextBadAlignValue) {
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);
    pstore::repo::section_content imported_content;

    // The align value must be a power of 2.
    auto const & parser = parse<pstore::repo::section_kind::text> (
        R"({ "align":7, "data":"" })", &db_, pstore::exchange::import_ns::string_mapping{},
        &inserter, &imported_content);
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::alignment_must_be_power_of_2));
}